

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

FlagValue * __thiscall
gflags::(anonymous_namespace)::FlagValue::ToString_abi_cxx11_(FlagValue *this)

{
  char *pcVar1;
  undefined8 *in_RSI;
  allocator local_71;
  allocator local_70;
  allocator local_6f;
  allocator local_6e;
  allocator local_6d [20];
  allocator local_59;
  char local_58 [8];
  char intbuf [64];
  FlagValue *this_local;
  
  switch(*(undefined1 *)(in_RSI + 1)) {
  case 0:
    pcVar1 = "false";
    if ((*(byte *)*in_RSI & 1) != 0) {
      pcVar1 = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar1,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    break;
  case 1:
    snprintf(local_58,0x40,"%d",(ulong)*(uint *)*in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,local_58,local_6d);
    std::allocator<char>::~allocator((allocator<char> *)local_6d);
    break;
  case 2:
    snprintf(local_58,0x40,"%u",(ulong)*(uint *)*in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,local_58,&local_6e);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e);
    break;
  case 3:
    snprintf(local_58,0x40,"%ld",*(undefined8 *)*in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,local_58,&local_6f);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f);
    break;
  case 4:
    snprintf(local_58,0x40,"%lu",*(undefined8 *)*in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,local_58,&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_70);
    break;
  case 5:
    snprintf(local_58,0x40,"%.17g",*(undefined8 *)*in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,local_58,&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    break;
  case 6:
    std::__cxx11::string::string((string *)this,(string *)*in_RSI);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                  ,0x189,"string gflags::(anonymous namespace)::FlagValue::ToString() const");
  }
  return this;
}

Assistant:

string FlagValue::ToString() const {
  char intbuf[64];    // enough to hold even the biggest number
  switch (type_) {
    case FV_BOOL:
      return VALUE_AS(bool) ? "true" : "false";
    case FV_INT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRId32, VALUE_AS(int32));
      return intbuf;
    case FV_UINT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu32, VALUE_AS(uint32));
      return intbuf;
    case FV_INT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRId64, VALUE_AS(int64));
      return intbuf;
    case FV_UINT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu64, VALUE_AS(uint64));
      return intbuf;
    case FV_DOUBLE:
      snprintf(intbuf, sizeof(intbuf), "%.17g", VALUE_AS(double));
      return intbuf;
    case FV_STRING:
      return VALUE_AS(string);
    default:
      assert(false);
      return "";  // unknown type
  }
}